

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

KeyValue<supermap::Key<128UL>,_unsigned_long> * __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
::get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
      *this,unsigned_long index)

{
  KeyValue<supermap::Key<128UL>,_unsigned_long> *in_RDI;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  *this_00;
  format fVar1;
  string_type *in_stack_ffffffffffffff78;
  path *in_stack_ffffffffffffff80;
  FileManager *in_stack_ffffffffffffff88;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  local_30;
  
  this_00 = &local_30;
  getFileManager(this_00);
  std::__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x283f89);
  fVar1 = (format)((ulong)&stack0xffffffffffffff88 >> 0x38);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
  ::getStorageFilePath_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,fVar1);
  io::FileManager::
  getInputIterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(uint64_t)in_stack_ffffffffffffff78
            );
  io::
  InputIterator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_136UL,_void>
  ::next((InputIterator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_136UL,_void>
          *)in_RDI);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_136UL,_void>
  ::~InputIterator((InputIterator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_136UL,_void>
                    *)0x284004);
  std::filesystem::__cxx11::path::~path((path *)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x284025);
  return in_RDI;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }